

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O2

void __thiscall VariationalBayesEstimatorOnLDA::calculateEx(VariationalBayesEstimatorOnLDA *this)

{
  uint uVar1;
  uint uVar2;
  pointer pvVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pvVar6;
  int d;
  ulong uVar7;
  int k;
  ulong uVar8;
  
  uVar1 = this->_K;
  uVar2 = this->_D;
  for (uVar7 = 0; uVar7 != uVar2; uVar7 = uVar7 + 1) {
    pvVar3 = (this->_ndk).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar6 = (this->_thetaEx).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
      *(double *)
       (*(long *)&pvVar6[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + uVar8 * 8) =
           (*(double *)
             (*(long *)&pvVar3[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + uVar8 * 8) + pdVar4[uVar8]) /
           (pdVar5[uVar7] + this->_alphaSum);
    }
  }
  uVar2 = this->_V;
  for (uVar7 = 0; uVar7 != uVar1; uVar7 = uVar7 + 1) {
    pvVar3 = (this->_nkv).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar6 = (this->_phiEx).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
      *(double *)
       (*(long *)&pvVar6[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + uVar8 * 8) =
           (*(double *)
             (*(long *)&pvVar3[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + uVar8 * 8) + pdVar4[uVar8]) /
           (pdVar5[uVar7] + this->_betaSum);
    }
  }
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::calculateEx(){//{{{
    for(int d=0;d<_D;d++){
        for(int k=0;k<_K;k++){
            _thetaEx[d][k]=(_ndk[d][k]+_alpha[k])/(_nd[d]+_alphaSum);
        }
    }
    for(int k=0;k<_K;k++){
        for(int v=0;v<_V;v++){
            _phiEx[k][v]=(_nkv[k][v]+_beta[v])/(_nk[k]+_betaSum);
        }
    }

}